

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterYs<short>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>::
operator()(ShadedRenderer<ImPlot::GetterYs<short>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  GetterYs<short> *pGVar5;
  TransformerLinLog *pTVar6;
  ImPlotPlot *pIVar7;
  GetterYRef *pGVar8;
  ImDrawVert *pIVar9;
  ImDrawIdx *pIVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [12];
  ImPlotContext *pIVar14;
  ImPlotContext *pIVar15;
  int iVar16;
  ushort uVar17;
  ImDrawIdx IVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar40 [16];
  
  pIVar14 = GImPlot;
  pGVar5 = this->Getter1;
  pTVar6 = this->Transformer;
  dVar11 = (double)(prim + 1);
  iVar16 = pGVar5->Count;
  dVar1 = pGVar5->XScale;
  dVar2 = pGVar5->X0;
  dVar12 = log10((double)(int)*(short *)((long)pGVar5->Ys +
                                        (long)(((prim + 1 + pGVar5->Offset) % iVar16 + iVar16) %
                                              iVar16) * (long)pGVar5->Stride) /
                 GImPlot->CurrentPlot->YAxis[pTVar6->YAxis].Range.Min);
  pIVar15 = GImPlot;
  iVar16 = pTVar6->YAxis;
  pIVar7 = pIVar14->CurrentPlot;
  dVar3 = pIVar7->YAxis[iVar16].Range.Min;
  pGVar8 = this->Getter2;
  pTVar6 = this->Transformer;
  IVar4 = pIVar14->PixelRange[iVar16].Min;
  fVar26 = (float)(pIVar14->Mx * ((dVar2 + dVar11 * dVar1) - (pIVar7->XAxis).Range.Min) +
                  (double)IVar4.x);
  fVar28 = (float)(pIVar14->My[iVar16] *
                   ((dVar3 + (double)(float)(dVar12 / pIVar14->LogDenY[iVar16]) *
                             (pIVar7->YAxis[iVar16].Range.Max - dVar3)) - dVar3) + (double)IVar4.y);
  dVar1 = pGVar8->XScale;
  dVar2 = pGVar8->X0;
  dVar12 = log10(pGVar8->YRef / GImPlot->CurrentPlot->YAxis[pTVar6->YAxis].Range.Min);
  iVar16 = pTVar6->YAxis;
  pIVar7 = pIVar15->CurrentPlot;
  dVar3 = pIVar7->YAxis[iVar16].Range.Min;
  IVar4 = pIVar15->PixelRange[iVar16].Min;
  fVar24 = (float)(pIVar15->Mx * ((dVar2 + dVar11 * dVar1) - (pIVar7->XAxis).Range.Min) +
                  (double)IVar4.x);
  fVar25 = (float)(pIVar15->My[iVar16] *
                   ((dVar3 + (double)(float)(dVar12 / pIVar15->LogDenY[iVar16]) *
                             (pIVar7->YAxis[iVar16].Range.Max - dVar3)) - dVar3) + (double)IVar4.y);
  fVar27 = (this->P12).x;
  fVar29 = (this->P12).y;
  fVar31 = (this->P11).y;
  fVar36 = (this->P11).x;
  uVar22 = -(uint)(fVar31 < fVar29);
  fVar30 = (float)(~-(uint)(fVar27 <= fVar36) & (uint)fVar27 |
                  (uint)fVar36 & -(uint)(fVar27 <= fVar36));
  fVar32 = (float)(~-(uint)(fVar29 <= fVar31) & (uint)fVar29 |
                  (uint)fVar31 & -(uint)(fVar29 <= fVar31));
  fVar35 = (float)(~-(uint)(fVar36 < fVar27) & (uint)fVar27 |
                  (uint)fVar36 & -(uint)(fVar36 < fVar27));
  fVar44 = (float)(~uVar22 & (uint)fVar29 | (uint)fVar31 & uVar22);
  uVar19 = -(uint)(fVar26 <= fVar30);
  uVar20 = -(uint)(fVar28 <= fVar32);
  uVar21 = -(uint)(fVar35 < fVar26);
  uVar23 = -(uint)(fVar44 < fVar28);
  fVar30 = (float)(~uVar19 & (uint)fVar26 | (uint)fVar30 & uVar19);
  fVar32 = (float)(~uVar20 & (uint)fVar28 | (uint)fVar32 & uVar20);
  fVar35 = (float)(~uVar21 & (uint)fVar26 | (uint)fVar35 & uVar21);
  fVar44 = (float)(~uVar23 & (uint)fVar28 | (uint)fVar44 & uVar23);
  uVar19 = -(uint)(fVar24 <= fVar30);
  uVar20 = -(uint)(fVar25 <= fVar32);
  uVar21 = -(uint)(fVar35 < fVar24);
  uVar23 = -(uint)(fVar44 < fVar25);
  auVar34._0_4_ = (uint)fVar30 & uVar19;
  auVar34._4_4_ = (uint)fVar32 & uVar20;
  auVar34._8_4_ = (uint)fVar35 & uVar21;
  auVar34._12_4_ = (uint)fVar44 & uVar23;
  auVar41._0_4_ = ~uVar19 & (uint)fVar24;
  auVar41._4_4_ = ~uVar20 & (uint)fVar25;
  auVar41._8_4_ = ~uVar21 & (uint)fVar24;
  auVar41._12_4_ = ~uVar23 & (uint)fVar25;
  auVar41 = auVar41 | auVar34;
  fVar30 = (cull_rect->Min).y;
  auVar43._4_4_ = -(uint)(fVar30 < auVar41._4_4_);
  auVar43._0_4_ = -(uint)((cull_rect->Min).x < auVar41._0_4_);
  auVar13._4_8_ = auVar41._8_8_;
  auVar13._0_4_ = -(uint)(auVar41._4_4_ < fVar30);
  auVar42._0_8_ = auVar13._0_8_ << 0x20;
  auVar42._8_4_ = -(uint)(auVar41._8_4_ < (cull_rect->Max).x);
  auVar42._12_4_ = -(uint)(auVar41._12_4_ < (cull_rect->Max).y);
  auVar43._8_8_ = auVar42._8_8_;
  iVar16 = movmskps((int)cull_rect,auVar43);
  if (iVar16 == 0xf) {
    fVar32 = fVar28 * fVar36 - fVar31 * fVar26;
    fVar35 = fVar25 * fVar27 - fVar29 * fVar24;
    fVar30 = fVar29 - fVar25;
    auVar37._4_4_ = fVar30;
    auVar37._0_4_ = fVar30;
    auVar37._8_4_ = fVar30;
    auVar37._12_4_ = fVar30;
    auVar38._4_12_ = auVar37._4_12_;
    auVar38._0_4_ = fVar30 * (fVar36 - fVar26) - (fVar31 - fVar28) * (fVar27 - fVar24);
    auVar33._0_4_ = fVar32 * (fVar27 - fVar24) - fVar35 * (fVar36 - fVar26);
    auVar33._4_4_ = fVar32 * fVar30 - fVar35 * (fVar31 - fVar28);
    auVar33._8_4_ = fVar28 * 0.0 - fVar25 * 0.0;
    auVar33._12_4_ = fVar28 * 0.0 - fVar25 * 0.0;
    auVar40._0_8_ = auVar38._0_8_;
    auVar40._8_4_ = fVar30;
    auVar40._12_4_ = fVar30;
    auVar39._8_8_ = auVar40._8_8_;
    auVar39._4_4_ = auVar38._0_4_;
    auVar39._0_4_ = auVar38._0_4_;
    auVar34 = divps(auVar33,auVar39);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->col = this->Col;
    pIVar9[1].pos.x = fVar26;
    pIVar9[1].pos.y = fVar28;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = this->Col;
    pIVar9[2].pos = auVar34._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = this->Col;
    pIVar9[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = this->Col;
    IVar4.y = fVar25;
    IVar4.x = fVar24;
    pIVar9[4].pos = IVar4;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar9 + 5;
    uVar19 = DrawList->_VtxCurrentIdx;
    pIVar10 = DrawList->_IdxWritePtr;
    IVar18 = (ImDrawIdx)uVar19;
    *pIVar10 = IVar18;
    uVar17 = (byte)((byte)uVar22 & fVar25 < fVar28 | -(fVar29 < fVar31) & -(fVar28 < fVar25)) & 1;
    pIVar10[1] = IVar18 + uVar17 + 1;
    pIVar10[2] = IVar18 + 3;
    pIVar10[3] = IVar18 + 1;
    pIVar10[4] = (uVar17 ^ 3) + IVar18;
    pIVar10[5] = IVar18 + 4;
    DrawList->_IdxWritePtr = pIVar10 + 6;
    DrawList->_VtxCurrentIdx = uVar19 + 5;
  }
  (this->P11).x = fVar26;
  (this->P11).y = fVar28;
  (this->P12).x = fVar24;
  (this->P12).y = fVar25;
  return (char)iVar16 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }